

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O3

void __thiscall
TApp_OptionFromDefaults_Test::TApp_OptionFromDefaults_Test(TApp_OptionFromDefaults_Test *this)

{
  string local_38;
  
  testing::Test::Test((Test *)this);
  (this->super_TApp).super_Test._vptr_Test = (_func_int **)&PTR__TApp_0016d530;
  local_38.field_2._M_allocated_capacity._0_7_ = 0x7473655420794d;
  local_38.field_2._M_local_buf[7] = ' ';
  local_38.field_2._8_7_ = 0x6d6172676f7250;
  local_38._M_string_length = 0xf;
  local_38.field_2._M_local_buf[0xf] = '\0';
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  CLI::App::App(&(this->super_TApp).app,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  (this->super_TApp).args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TApp).args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TApp).args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TApp).super_Test._vptr_Test = (_func_int **)&PTR__TApp_0016d310;
  return;
}

Assistant:

TEST_F(TApp, OptionFromDefaults) {
    app.option_defaults()->required();

    // Options should remember defaults
    int x;
    auto opt = app.add_option("--simple", x);
    EXPECT_TRUE(opt->get_required());

    // Flags cannot be required
    auto flag = app.add_flag("--other");
    EXPECT_FALSE(flag->get_required());

    app.option_defaults()->required(false);
    auto opt2 = app.add_option("--simple2", x);
    EXPECT_FALSE(opt2->get_required());

    app.option_defaults()->required()->ignore_case();

    auto opt3 = app.add_option("--simple3", x);
    EXPECT_TRUE(opt3->get_required());
    EXPECT_TRUE(opt3->get_ignore_case());
}